

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bread.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  string *input;
  string inputPath;
  string dateFormat;
  string format;
  ifstream inputFile;
  
  std::__cxx11::string::string((string *)&inputPath,"-",(allocator *)&inputFile);
  std::__cxx11::string::string
            ((string *)&format,"%S %C [%d] %n %m (%G:%L)\n",(allocator *)&inputFile);
  std::__cxx11::string::string((string *)&dateFormat,"%Y-%m-%d %H:%M:%S.%N",(allocator *)&inputFile)
  ;
  bVar1 = false;
  while( true ) {
    while( true ) {
      while( true ) {
        iVar3 = getopt(argc,argv,"f:d:sh");
        if (iVar3 != 100) break;
        std::__cxx11::string::assign((char *)&dateFormat);
      }
      if (iVar3 != 0x66) break;
      std::__cxx11::string::assign((char *)&format);
      std::__cxx11::string::append((char *)&format);
    }
    if (iVar3 == -1) {
      if (_optind < argc) {
        std::__cxx11::string::assign((char *)&inputPath);
      }
      input = (string *)&inputFile;
      std::ifstream::ifstream(input);
      bVar2 = std::operator==(&inputPath,"-");
      if (bVar2) {
        input = (string *)&std::cin;
      }
      else {
        std::ifstream::open(input,(_Ios_Openmode)&inputPath);
      }
      if (((byte)((istream *)input)[*(long *)(*(long *)input + -0x18) + 0x20] & 5) == 0) {
        std::ios_base::sync_with_stdio(false);
        if (bVar1) {
          printSortedEvents((istream *)input,(ostream *)&std::cout,&format,&dateFormat);
        }
        else {
          printEvents((istream *)input,(ostream *)&std::cout,&format,&dateFormat);
        }
        iVar3 = 0;
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cerr,"[bread] Failed to open \'");
        poVar4 = std::operator<<(poVar4,(string *)&inputPath);
        std::operator<<(poVar4,"\' for reading\n");
        iVar3 = 2;
      }
      std::ifstream::~ifstream(&inputFile);
      goto LAB_001036ab;
    }
    if (iVar3 == 0x68) {
      iVar3 = 0;
      anon_unknown.dwarf_1ee3::showHelp();
      goto LAB_001036ab;
    }
    if (iVar3 != 0x73) break;
    bVar1 = true;
  }
  anon_unknown.dwarf_1ee3::showHelp();
  iVar3 = 1;
LAB_001036ab:
  std::__cxx11::string::~string((string *)&dateFormat);
  std::__cxx11::string::~string((string *)&format);
  std::__cxx11::string::~string((string *)&inputPath);
  return iVar3;
}

Assistant:

int main(int argc, /*const*/ char* argv[])
{
  std::string inputPath = "-";
  std::string format = BINLOG_DEFAULT_FORMAT "\n";
  std::string dateFormat = BINLOG_DEFAULT_DATE_FORMAT;
  bool sorted = false;

  int opt;
  while ((opt = getopt(argc, argv, "f:d:sh")) != -1) // NOLINT(concurrency-mt-unsafe)
  {
    switch (opt)
    {
    case 'f':
      format = optarg;
      format += "\n";
      break;
    case 'd':
      dateFormat = optarg;
      break;
    case 's':
      sorted = true;
      break;
    case 'h':
      showHelp();
      return 0;
    default:
      // getopt prints a useful error message by default (opterr is set)
      showHelp();
      return 1;
    }
  }

  if (optind < argc)
  {
    inputPath = argv[optind];
  }

  std::ifstream inputFile;
  std::istream& input = openFile(inputPath, inputFile);
  if (! input)
  {
    std::cerr << "[bread] Failed to open '" << inputPath << "' for reading\n";
    return 2;
  }

  std::ostream::sync_with_stdio(false);

  try
  {
    if (sorted)
    {
      printSortedEvents(input, std::cout, format, dateFormat);
    }
    else
    {
      printEvents(input, std::cout, format, dateFormat);
    }
  }
  catch (const std::exception& ex)
  {
    std::cerr << "[bread] Exception: " << ex.what() << "\n";
    return 3;
  }

  return 0;
}